

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_add_stat(REF_HISTOGRAM ref_histogram,REF_DBL observation)

{
  REF_STATUS RVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  if (observation <= 0.0) {
    RVar1 = 3;
  }
  else {
    dVar3 = log2(observation);
    RVar1 = 0;
    for (lVar2 = 0; lVar2 < ref_histogram->nstat; lVar2 = lVar2 + 1) {
      dVar4 = pow(dVar3 - ref_histogram->log_mean,(double)(int)lVar2);
      ref_histogram->stats[lVar2] = dVar4 + ref_histogram->stats[lVar2];
    }
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add_stat(REF_HISTOGRAM ref_histogram,
                                          REF_DBL observation) {
  REF_INT i;
  REF_DBL log_obs;

  if (observation <= 0.0) return REF_INVALID;

  log_obs = log2(observation);

  for (i = 0; i < ref_histogram_nstat(ref_histogram); i++)
    ref_histogram_stat(ref_histogram, i) +=
        pow(log_obs - ref_histogram_log_mean(ref_histogram), i);

  return REF_SUCCESS;
}